

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Own<void,_std::nullptr_t> __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::awaitThirdParty
          (ConnectionImpl *this,Reader party,Rc<kj::Refcounted> *value)

{
  PromiseFulfiller<kj::Rc<kj::Refcounted>_> *pPVar1;
  Rc<kj::Refcounted> *pRVar2;
  Rc<kj::Refcounted> *in_RDX;
  Type *func;
  void *extraout_RDX;
  Own<void,_std::nullptr_t> OVar3;
  undefined1 local_68 [40];
  ThirdPartyExchange *local_30;
  ThirdPartyExchange *xchg;
  uint64_t token;
  Rc<kj::Refcounted> *value_local;
  ConnectionImpl *this_local;
  
  value_local = value;
  this_local = this;
  xchg = (ThirdPartyExchange *)
         capnproto_test::capnp::test::TestThirdPartyToAwait::Reader::getToken(&party);
  local_30 = getTphExchange((TestVat *)value[2].own.disposer,(uint64_t)xchg);
  pPVar1 = kj::Own<kj::PromiseFulfiller<kj::Rc<kj::Refcounted>_>,_std::nullptr_t>::operator->
                     (&local_30->fulfiller);
  pRVar2 = kj::mv<kj::Rc<kj::Refcounted>>(in_RDX);
  (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,pRVar2);
  local_68._8_8_ = xchg;
  local_68._0_8_ = value;
  kj::
  defer<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::awaitThirdParty(capnproto_test::capnp::test::TestThirdPartyToAwait::Reader,kj::Rc<kj::Refcounted>)::_lambda()_1_>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:529:33)>
              *)(local_68 + 0x10),(kj *)local_68,func);
  kj::
  heap<kj::_::Deferred<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::awaitThirdParty(capnproto_test::capnp::test::TestThirdPartyToAwait::Reader,kj::Rc<kj::Refcounted>)::_lambda()_1_>>
            ((kj *)&stack0xffffffffffffffc0,
             (Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:529:33)>
              *)(local_68 + 0x10));
  kj::Own<void,decltype(nullptr)>::
  Own<kj::_::Deferred<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::awaitThirdParty(capnproto_test::capnp::test::TestThirdPartyToAwait::Reader,kj::Rc<kj::Refcounted>)::_lambda()_1_>,void>
            ((Own<void,decltype(nullptr)> *)this,
             (Own<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:529:33)>,_std::nullptr_t>
              *)&stack0xffffffffffffffc0);
  kj::
  Own<kj::_::Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:529:33)>,_std::nullptr_t>
  ::~Own((Own<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:529:33)>,_std::nullptr_t>
          *)&stack0xffffffffffffffc0);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:529:33)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:529:33)>
               *)(local_68 + 0x10));
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

kj::Own<void> awaitThirdParty(
        test::TestThirdPartyToAwait::Reader party,
        kj::Rc<kj::Refcounted> value) override {
      uint64_t token = party.getToken();
      auto& xchg = vat.getTphExchange(token);
      xchg.fulfiller->fulfill(kj::mv(value));

      return kj::heap(kj::defer([this, token]() {
        vat.tphExchanges.erase(token);
      }));
    }